

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

bool wasm::Debug::hasDWARFSections(Module *wasm)

{
  bool bVar1;
  char *extraout_RDX;
  Name name;
  Name local_48;
  reference local_38;
  CustomSection *section;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *__range2;
  Module *wasm_local;
  
  __end2 = std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::begin
                     (&wasm->customSections);
  section = (CustomSection *)
            std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::end
                      (&wasm->customSections);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
                                *)&section);
    if (!bVar1) {
      return false;
    }
    local_38 = __gnu_cxx::
               __normal_iterator<const_wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
               ::operator*(&__end2);
    wasm::Name::Name(&local_48,&local_38->name);
    name.super_IString.str._M_str = extraout_RDX;
    name.super_IString.str._M_len = (size_t)local_48.super_IString.str._M_str;
    bVar1 = isDWARFSection((Debug *)local_48.super_IString.str._M_len,name);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
    ::operator++(&__end2);
  }
  return true;
}

Assistant:

bool hasDWARFSections(const Module& wasm) {
  for (auto& section : wasm.customSections) {
    if (isDWARFSection(section.name)) {
      return true;
    }
  }
  return false;
}